

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

StringIntMap * __thiscall
glcts::LayoutBindingProgram::getUniformLocations
          (StringIntMap *__return_storage_ptr__,LayoutBindingProgram *this,StringVector *args)

{
  _Rb_tree_header *p_Var1;
  char *__s;
  bool bVar2;
  GLint GVar3;
  mapped_type_conflict *pmVar4;
  pointer pbVar5;
  allocator<char> local_61;
  StringIntMap *local_60;
  StringVector *local_58;
  key_type local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = __return_storage_ptr__;
  if (pbVar5 != (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
    local_58 = args;
    do {
      __s = (pbVar5->_M_dataplus)._M_p;
      GVar3 = (*this->m_gl->getUniformLocation)((this->m_program->m_program).m_program,__s);
      bVar2 = (bool)(bVar2 & -1 < GVar3);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_61);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](local_60,&local_50);
        *pmVar4 = GVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (local_58->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return local_60;
}

Assistant:

String initDefaultVSContext()
	{
		m_templates[VertexShader] = "${VERSION}"
									"layout(location=0) in vec2 inPosition;\n"
									"${UNIFORM_DECL}\n"
									"flat out ${OUT_VAR_TYPE} fragColor;\n"
									"${OPTIONAL_FUNCTION_BLOCK}\n"
									"void main(void)\n"
									"{\n"
									"  ${OUT_ASSIGNMENT} ${UNIFORM_ACCESS}\n"
									"  gl_Position = vec4(inPosition, 0.0, 1.0);\n"
									"}\n";

		StringMap& args = m_templateParams[VertexShader];
		// some samplers and all images don't have default precision qualifier (sampler3D)
		// so append a precision default in all sampler and image cases.
		StringStream s;
		s << glu::getGLSLVersionDeclaration(m_glslVersion) << "\n";
		s << "precision highp float;\n";
		if (needsPrecision())
		{
			s << "precision highp " << getTestParameters().uniform_type << ";\n";
		}

		args["VERSION"]					= s.str();
		args["UNIFORM_DECL"]			= "";
		args["OPTIONAL_FUNCTION_BLOCK"] = "";
		args["UNIFORM_ACCESS"]			= "";
		args["OUT_ASSIGNMENT"]			= "fragColor =";
		args["OUT_VAR_TYPE"]			= getTestParameters().vector_type;
		args["OUT_VAR"]					= "fragColor";
		if (m_stage.type != VertexShader)
		{
			args["OUT_ASSIGNMENT"] = "";
		}
		return tcu::StringTemplate(m_templates[VertexShader]).specialize(args);
	}